

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.cpp
# Opt level: O0

DArray<int> * Kernel::PrecedenceOrdering::funcPrecFromOpts(Problem *prb,Options *opt)

{
  RangeIterator<unsigned_int> it;
  byte bVar1;
  ulong uVar2;
  char *pcVar3;
  istream *piVar4;
  uint *puVar5;
  Options *in_RDX;
  DArray<int> *in_RDI;
  uint i;
  ifstream precedence_file;
  string precedence;
  DArray<unsigned_int> aux;
  uint nFunctions;
  DArray<int> *functionPrecedences;
  undefined4 in_stack_fffffffffffffd00;
  uint in_stack_fffffffffffffd04;
  size_t in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  uint in_stack_fffffffffffffd2c;
  undefined8 in_stack_fffffffffffffd30;
  uint local_2a8;
  istream local_2a0 [36];
  SymbolType in_stack_fffffffffffffd84;
  Options *in_stack_fffffffffffffd88;
  DArray<unsigned_int> *in_stack_fffffffffffffd90;
  string *in_stack_ffffffffffffff18;
  DArray<unsigned_int> *in_stack_ffffffffffffff20;
  string local_98 [32];
  RangeIterator<unsigned_int> local_78;
  RangeIterator<unsigned_int> local_68;
  RangeIterator<unsigned_int> local_48;
  DArray<unsigned_int> local_38;
  uint local_1c;
  Options *local_18;
  
  local_18 = in_RDX;
  local_1c = Signature::functions((Signature *)0x8b5d6c);
  Lib::DArray<unsigned_int>::DArray
            ((DArray<unsigned_int> *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
             in_stack_fffffffffffffd08);
  if (local_1c != 0) {
    local_78 = Lib::getRangeIterator<unsigned_int>
                         ((uint)in_stack_fffffffffffffd08,in_stack_fffffffffffffd04);
    it._from = (int)in_stack_fffffffffffffd30;
    it._to = (int)((ulong)in_stack_fffffffffffffd30 >> 0x20);
    it._next = in_stack_fffffffffffffd2c;
    local_68 = local_78;
    local_48 = local_78;
    Lib::DArray<unsigned_int>::initFromIterator<Lib::RangeIterator<unsigned_int>>
              ((DArray<unsigned_int> *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10)
               ,it,in_stack_fffffffffffffd08);
    Shell::Options::functionPrecedence_abi_cxx11_(local_18);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::string(local_98);
      Shell::Options::functionPrecedence_abi_cxx11_(local_18);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(local_2a0,pcVar3,_S_in);
      bVar1 = std::ifstream::is_open();
      if ((bVar1 & 1) != 0) {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_2a0,local_98);
        in_stack_fffffffffffffd17 =
             std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
        if ((bool)in_stack_fffffffffffffd17) {
          loadPermutationFromString(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
          std::ifstream::close();
        }
      }
      std::ifstream::~ifstream(local_2a0);
      std::__cxx11::string::~string(local_98);
    }
    else {
      sortAuxBySymbolPrecedence
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd84);
    }
  }
  Lib::DArray<int>::DArray
            ((DArray<int> *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
             in_stack_fffffffffffffd08);
  for (local_2a8 = 0; local_2a8 < local_1c; local_2a8 = local_2a8 + 1) {
    in_stack_fffffffffffffd04 = local_2a8;
    puVar5 = Lib::DArray<unsigned_int>::operator[](&local_38,(ulong)local_2a8);
    puVar5 = (uint *)Lib::DArray<int>::operator[](in_RDI,(ulong)*puVar5);
    *puVar5 = in_stack_fffffffffffffd04;
  }
  Lib::DArray<unsigned_int>::~DArray
            ((DArray<unsigned_int> *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  return in_RDI;
}

Assistant:

DArray<int> PrecedenceOrdering::funcPrecFromOpts(Problem& prb, const Options& opt) {
  unsigned nFunctions = env.signature->functions();
  DArray<unsigned> aux(nFunctions);

  if(nFunctions) {
    aux.initFromIterator(getRangeIterator(0u, nFunctions), nFunctions);

    if (!opt.functionPrecedence().empty()) {
      std::string precedence;
      ifstream precedence_file (opt.functionPrecedence().c_str());
      if (precedence_file.is_open() && getline(precedence_file, precedence)) {
        loadPermutationFromString(aux,precedence);
        precedence_file.close();
      }
    } else {
      sortAuxBySymbolPrecedence(aux,opt,SymbolType::FUNC);
    }
  }

  DArray<int>  functionPrecedences(nFunctions);
  for(unsigned i=0;i<nFunctions;i++) {
    functionPrecedences[aux[i]]=i;
  }
  return functionPrecedences;
}